

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::
VectorArgMinMaxBase<duckdb::LessThan,_false,_(duckdb::OrderType)2,_duckdb::SpecializedGenericArgMinMaxState>
::Bind(VectorArgMinMaxBase<duckdb::LessThan,_false,_(duckdb::OrderType)2,_duckdb::SpecializedGenericArgMinMaxState>
       *this,ClientContext *context,AggregateFunction *function,
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      *arguments)

{
  reference pvVar1;
  pointer pEVar2;
  reference this_00;
  reference pvVar3;
  
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if ((pEVar2->return_type).physical_type_ == VARCHAR) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,1);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    ExpressionBinder::PushCollation(context,pvVar1,&pEVar2->return_type,ALL_COLLATIONS);
  }
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  pvVar3 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if (pvVar3 != &pEVar2->return_type) {
    pvVar3->id_ = (pEVar2->return_type).id_;
    pvVar3->physical_type_ = (pEVar2->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&pvVar3->type_info_,&(pEVar2->return_type).type_info_);
  }
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if (&(function->super_BaseScalarFunction).return_type != &pEVar2->return_type) {
    (function->super_BaseScalarFunction).return_type.id_ = (pEVar2->return_type).id_;
    (function->super_BaseScalarFunction).return_type.physical_type_ =
         (pEVar2->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(function->super_BaseScalarFunction).return_type.type_info_,
               &(pEVar2->return_type).type_info_);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, AggregateFunction &function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		if (arguments[1]->return_type.InternalType() == PhysicalType::VARCHAR) {
			ExpressionBinder::PushCollation(context, arguments[1], arguments[1]->return_type);
		}
		function.arguments[0] = arguments[0]->return_type;
		function.return_type = arguments[0]->return_type;
		return nullptr;
	}